

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O1

void __thiscall gv_visitor::visit(gv_visitor *this,DeclarationsWithMethod *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Declarations *second;
  MethodDeclaration *second_00;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"decl with method","");
  box(this,ptr,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  second = ptr->prev_decls;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"decls","");
  arrow(this,ptr,second,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->prev_decls->super_Base)._vptr_Base)(ptr->prev_decls,this);
  second_00 = ptr->method_decl;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"method decl","");
  arrow(this,ptr,second_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**(ptr->method_decl->super_Declaration).super_Base._vptr_Base)(ptr->method_decl,this);
  return;
}

Assistant:

void gv_visitor::visit(DeclarationsWithMethod* ptr) {
    box(ptr, "decl with method");
    arrow(ptr, ptr->prev_decls, "decls");
    ptr->prev_decls->accept(this);
    arrow(ptr, ptr->method_decl, "method decl");
    ptr->method_decl->accept(this);
}